

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)32,1ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar1;
  TTDVar pvVar2;
  FileReader *reader_00;
  FileReader *reader_01;
  JsRTVarsArgumentAction_InternalUse<1UL> *vAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)32>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar2 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  pJVar1->Result = pvVar2;
  pvVar2 = NSSnapValues::ParseTTDVar((NSSnapValues *)&DAT_00000001,SUB81(reader,0),reader_01);
  pJVar1->VarArray[0] = pvVar2;
  return;
}

Assistant:

void JsRTVarsArgumentAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarsArgumentAction_InternalUse<count>* vAction = GetInlineEventDataAs<JsRTVarsArgumentAction_InternalUse<count>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            if(count == 1)
            {
                vAction->VarArray[0] = NSSnapValues::ParseTTDVar(true, reader);
            }
            else
            {
                reader->ReadSequenceStart_WDefaultKey(true);
                for(size_t i = 0; i < count; ++i)
                {
                    vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }
        }